

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O3

void garray_free(_garray *x)

{
  t_symbol *ptVar1;
  t_pd *x_00;
  
  sys_unqueuegui(x);
  if ((x->field_0x30 & 8) != 0) {
    x->field_0x30 = x->field_0x30 & 0xf7;
    pdgui_vmess("pdtk_array_listview_closeWindow","s",x->x_realname->s_name);
  }
  pdgui_stub_deleteforkey(x);
  pd_unbind((t_pd *)x,x->x_realname);
  ptVar1 = gensym("#A");
  x_00 = pd_findbyclass(ptVar1,garray_class);
  while (x_00 != (t_pd *)0x0) {
    ptVar1 = gensym("#A");
    pd_unbind(x_00,ptVar1);
    ptVar1 = gensym("#A");
    x_00 = pd_findbyclass(ptVar1,garray_class);
  }
  pd_free((t_pd *)x->x_scalar);
  return;
}

Assistant:

static void garray_free(t_garray *x)
{
    t_pd *x2;
        sys_unqueuegui(&x->x_gobj);
    /* jsarlo { */
    if (x->x_listviewing)
    {
        garray_arrayviewlist_close(x);
    }
    /* } jsarlo */
    pdgui_stub_deleteforkey(x);
    pd_unbind(&x->x_gobj.g_pd, x->x_realname);
        /* just in case we're still bound to #A from loading... */
    while ((x2 = pd_findbyclass(gensym("#A"), garray_class)))
        pd_unbind(x2, gensym("#A"));
    pd_free(&x->x_scalar->sc_gobj.g_pd);
}